

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-accel.c
# Opt level: O2

void fy_accel_entry_remove(fy_accel *xl,fy_accel_entry *xle)

{
  list_head *plVar1;
  list_head *plVar2;
  
  if (xle == (fy_accel_entry *)0x0 || xl == (fy_accel *)0x0) {
    return;
  }
  fy_accel_hash_to_pos(xl,xle + 1,xl->nbuckets);
  if (xl->buckets != (fy_accel_entry_list *)0x0) {
    plVar1 = (xle->node).next;
    plVar2 = (xle->node).prev;
    plVar1->prev = plVar2;
    plVar2->next = plVar1;
    (xle->node).next = &xle->node;
    (xle->node).prev = &xle->node;
  }
  if (xl->count != 0) {
    xl->count = xl->count - 1;
    free(xle);
    return;
  }
  __assert_fail("xl->count > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-accel.c"
                ,0x115,"void fy_accel_entry_remove(struct fy_accel *, struct fy_accel_entry *)");
}

Assistant:

void
fy_accel_entry_remove(struct fy_accel *xl, struct fy_accel_entry *xle) {
    unsigned int pos;

    if (!xl || !xle)
        return;

    pos = fy_accel_hash_to_pos(xl, xle->hash, xl->nbuckets);

    fy_accel_entry_list_del(&xl->buckets[pos], xle);

    assert(xl->count > 0);
    xl->count--;

    free(xle);
}